

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_FloorAndCeiling_LowerRaise
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  
  bVar1 = EV_DoCeiling(ceilRaiseToHighest,ln,arg0,(double)arg2 * 0.125,0.0,0.0,0,0,0,crushDoom);
  if (arg3 == 0x7ce && bVar1) {
    uVar3 = 1;
  }
  else {
    bVar2 = EV_DoFloor(floorLowerToLowest,ln,arg0,(double)arg1 * 0.125,0.0,-1,0,false,false);
    uVar3 = (uint)(bVar1 || bVar2);
  }
  return uVar3;
}

Assistant:

FUNC(LS_FloorAndCeiling_LowerRaise)
// FloorAndCeiling_LowerRaise (tag, fspeed, cspeed, boomemu)
{
	bool res = EV_DoCeiling (DCeiling::ceilRaiseToHighest, ln, arg0, SPEED(arg2), 0, 0, 0, 0, 0);
	// The switch based Boom equivalents of FloorandCeiling_LowerRaise do incorrect checks
	// which cause the floor only to move when the ceiling fails to do so.
	// To avoid problems with maps that have incorrect args this only uses a 
	// more or less unintuitive value for the fourth arg to trigger Boom's broken behavior
	if (arg3 != 1998 || !res)	// (1998 for the year in which Boom was released... :P)
	{
		res |= EV_DoFloor (DFloor::floorLowerToLowest, ln, arg0, SPEED(arg1), 0, -1, 0, false);
	}
	return res;
}